

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O0

void __thiscall cfd::core::Deserializer::CheckReadSize(Deserializer *this,uint64_t size)

{
  uint uVar1;
  CfdException *pCVar2;
  size_type sVar3;
  allocator local_a1;
  string local_a0;
  CfdSourceLocation local_80;
  undefined1 local_65;
  allocator local_51;
  string local_50;
  CfdSourceLocation local_30;
  uint64_t local_18;
  uint64_t size_local;
  Deserializer *this_local;
  
  local_18 = size;
  size_local = (uint64_t)this;
  uVar1 = ::std::numeric_limits<unsigned_int>::max();
  if (uVar1 < size) {
    local_30.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_30.filename = local_30.filename + 1;
    local_30.line = 0x291;
    local_30.funcname = "CheckReadSize";
    logger::warn<>(&local_30,"It exceeds the handling size.");
    local_65 = 1;
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_50,"It exceeds the handling size.",&local_51);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_50);
    local_65 = 0;
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->buffer_);
  if (sVar3 < this->offset_ + local_18) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_bytedata.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x295;
    local_80.funcname = "CheckReadSize";
    logger::warn<>(&local_80,"deserialize buffer EOF.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a0,"deserialize buffer EOF.",&local_a1);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,&local_a0);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void Deserializer::CheckReadSize(uint64_t size) {
  if (size > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  if (buffer_.size() < (offset_ + size)) {
    warn(CFD_LOG_SOURCE, "deserialize buffer EOF.");
    throw CfdException(kCfdIllegalStateError, "deserialize buffer EOF.");
  }
}